

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

void interpolate(uint8_t *input,int in_length,uint8_t *output,int out_length)

{
  int in_ECX;
  int in_ESI;
  InterpKernel *interp_filters;
  int in_stack_0000009c;
  int16_t *in_stack_000000a0;
  int in_stack_000000ac;
  uint8_t *in_stack_000000b0;
  int in_stack_000000bc;
  uint8_t *in_stack_000000c0;
  
  choose_interp_filter(in_ESI,in_ECX);
  interpolate_core(in_stack_000000c0,in_stack_000000bc,in_stack_000000b0,in_stack_000000ac,
                   in_stack_000000a0,in_stack_0000009c);
  return;
}

Assistant:

static void interpolate(const uint8_t *const input, int in_length,
                        uint8_t *output, int out_length) {
  const InterpKernel *interp_filters =
      choose_interp_filter(in_length, out_length);

  interpolate_core(input, in_length, output, out_length, &interp_filters[0][0],
                   SUBPEL_TAPS);
}